

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

bool checktargetext(LinkedSection *ls,uint8_t id,uint8_t subid)

{
  node **ppnVar1;
  node *pnVar2;
  node *pnVar3;
  
  pnVar2 = (ls->sections).first;
  do {
    ppnVar1 = &pnVar2->next;
    if (*ppnVar1 == (node *)0x0) {
      return 0;
    }
    for (pnVar3 = pnVar2[9].pred; pnVar2 = *ppnVar1, pnVar3 != (node *)0x0; pnVar3 = pnVar3->next) {
      if (*(uint8_t *)&pnVar3->pred == id) {
        if (subid == '\0') {
          return 1;
        }
        if (*(uint8_t *)((long)&pnVar3->pred + 1) == subid) {
          return 1;
        }
      }
    }
  } while( true );
}

Assistant:

bool checktargetext(struct LinkedSection *ls,uint8_t id,uint8_t subid)
/* Checks if one of the sections in LinkedSection has a TargetExt */
/* block with the given id. If subid = 0 it will be ignored. */
{
  struct Section *sec = (struct Section *)ls->sections.first;
  struct Section *nextsec;
  struct TargetExt *te;

  while (nextsec = (struct Section *)sec->n.next) {
    if (te = sec->special) {
      do {
        if (te->id==id && (te->sub_id==subid || subid==0))
          return TRUE;
      }
      while (te = te->next);
    }
    sec = nextsec;
  }
  return FALSE;
}